

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary.h
# Opt level: O0

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
lf::mesh::utils::internal::OperatorSubtraction::operator()
          (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,OperatorSubtraction *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *u,vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             *v,int param_3)

{
  ulong uVar1;
  size_type sVar2;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar3;
  Index IVar4;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *pPVar5;
  Index IVar6;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_00;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *other;
  Matrix<double,2,1,0,2,1> *this_01;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  local_568;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  stringstream local_468 [8];
  stringstream ss_1;
  ostream local_458 [383];
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  stringstream local_1f8 [8];
  stringstream ss;
  ostream local_1e8 [376];
  ulong local_70;
  size_t i;
  allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_51;
  undefined1 local_50 [8];
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  result;
  int fixedCols;
  int fixedRows;
  int param_3_local;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *v_local;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *u_local;
  OperatorSubtraction *this_local;
  
  result.
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  sVar2 = std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(u);
  std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::allocator(&local_51);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            *)local_50,sVar2,&local_51);
  std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~allocator(&local_51);
  local_70 = 0;
  while( true ) {
    uVar1 = local_70;
    sVar2 = std::
            vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(u);
    if (sVar2 <= uVar1) {
      std::
      vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ::vector(__return_storage_ptr__,
               (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)local_50);
      std::
      vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ::~vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                 *)local_50);
      return __return_storage_ptr__;
    }
    pPVar3 = &std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](u,local_70)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
    IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows(pPVar3);
    pPVar5 = &std::
              vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::operator[](v,local_70)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
    ;
    IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::rows(pPVar5);
    if (IVar4 != IVar6) break;
    pPVar3 = &std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](u,local_70)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
    IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cols(pPVar3);
    pPVar5 = &std::
              vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::operator[](v,local_70)->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
    ;
    IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::cols(pPVar5);
    if (IVar4 != IVar6) {
      std::__cxx11::stringstream::stringstream(local_468);
      std::operator<<(local_458,"mismatch in #cols of matrices subtracted from each other.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"u[i].cols() == v[i].cols()",&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
                 ,&local_4b1);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_488,&local_4b0,0x148,&local_4d8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"false",&local_4f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_520,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
                 ,&local_521);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"",&local_549);
      lf::base::AssertionFailed(&local_4f8,&local_520,0x148,&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      std::allocator<char>::~allocator(&local_549);
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator(&local_521);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      abort();
    }
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
              std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](u,local_70);
    other = (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
            std::
            vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            ::operator[](v,local_70);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-(&local_568,this_00,other);
    this_01 = (Matrix<double,2,1,0,2,1> *)
              std::
              vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                            *)local_50,local_70);
    Eigen::Matrix<double,2,1,0,2,1>::operator=
              (this_01,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                        *)&local_568);
    local_70 = local_70 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1f8);
  std::operator<<(local_1e8,"mismatch in #rows of matrices subtracted from each other.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"u[i].rows() == v[i].rows()",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
             ,&local_241);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_218,&local_240,0x145,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"false",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_binary.h"
             ,&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"",&local_2d9);
  lf::base::AssertionFailed(&local_288,&local_2b0,0x145,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  abort();
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S1, R1, C1, O1, MR1, MC1>>& u,
                  const std::vector<Eigen::Matrix<S2, R2, C2, O2, MR2, MC2>>& v,
                  int /*unused*/) const {
    using scalar_t = decltype(S1(0) + S2(0));  // NOLINT
    if constexpr (R1 != Eigen::Dynamic && C1 != Eigen::Dynamic &&
                  R2 != Eigen::Dynamic && C2 != Eigen::Dynamic) {  // NOLINT
      // subtract two static size eigen matrices from each other
      static_assert(R1 == R2, "cannot subtract matrices with different #rows.");
      static_assert(C1 == C2, "cannot subtract matrices with different #cols.");

      Eigen::Map<const Eigen::Matrix<S1, 1, Eigen::Dynamic>> um(
          &u[0](0, 0), 1, u.size() * R1 * C1);
      Eigen::Map<const Eigen::Matrix<S2, 1, Eigen::Dynamic>> vm(
          &v[0](0, 0), 1, v.size() * R1 * C1);

      std::vector<Eigen::Matrix<scalar_t, R1, C1>> result(u.size());
      Eigen::Map<Eigen::Matrix<scalar_t, 1, Eigen::Dynamic>> rm(
          &result[0](0, 0), 1, u.size() * R1 * C1);
      rm = um - vm;
      return result;
    }
    if constexpr ((R1 != Eigen::Dynamic && C1 != Eigen::Dynamic) ||
                  (R2 != Eigen::Dynamic && C2 != Eigen::Dynamic)) {  // NOLINT
      // One of the matrices is fixed size:
      constexpr int fixedRows = std::max(R1, R2);
      constexpr int fixedCols = std::max(C1, C2);

      std::vector<Eigen::Matrix<scalar_t, fixedRows, fixedCols>> result(
          u.size());
      for (std::size_t i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(
            u[i].rows() == v[i].rows(),
            "mismatch in #rows of matrices subtracted from each other.");
        LF_ASSERT_MSG(
            u[i].cols() == v[i].cols(),
            "mismatch in #cols of matrices subtracted from each other.");
        result[i] = u[i] - v[i];
      }
      return result;
    } else {  // NOLINT
      // subtract two dynamic sized matrices from each other:
      std::vector<Eigen::Matrix<scalar_t, Eigen::Dynamic, Eigen::Dynamic>>
          result;
      result.reserve(u.size());
      for (unsigned long i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(
            u[i].rows() == v[i].rows(),
            "mismatch in #rows of matrices subtracted from each other.");
        LF_ASSERT_MSG(
            u[i].cols() == v[i].cols(),
            "mismatch in #cols of matrices subtracted from each other.");
        result.emplace_back(u[i] - v[i]);
      }
      return result;
    }
  }